

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void vec_gen_4_sparc(TCGContext_conflict7 *tcg_ctx,TCGOpcode opc,TCGType_conflict type,uint vece,
                    TCGArg r,TCGArg a,TCGArg b,TCGArg c)

{
  TCGOp *pTVar1;
  TCGOp *op;
  TCGArg a_local;
  TCGArg r_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGOpcode opc_local;
  TCGContext_conflict7 *tcg_ctx_local;
  
  pTVar1 = tcg_emit_op_sparc(tcg_ctx,opc);
  *(TCGType_conflict *)pTVar1 = *(uint *)pTVar1 & 0xfffff0ff | (type - TCG_TYPE_V64 & 0xf) << 8;
  *(uint *)pTVar1 = *(uint *)pTVar1 & 0xffff0fff | (vece & 0xf) << 0xc;
  pTVar1->args[0] = r;
  pTVar1->args[1] = a;
  pTVar1->args[2] = b;
  pTVar1->args[3] = c;
  return;
}

Assistant:

void vec_gen_4(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
               TCGArg r, TCGArg a, TCGArg b, TCGArg c)
{
    TCGOp *op = tcg_emit_op(tcg_ctx, opc);
    TCGOP_VECL(op) = type - TCG_TYPE_V64;
    TCGOP_VECE(op) = vece;
    op->args[0] = r;
    op->args[1] = a;
    op->args[2] = b;
    op->args[3] = c;
}